

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::insert
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  Inserter *in_RCX;
  long lVar2;
  long in_RDX;
  QArrayDataPointer<QDBusMenuItem> *in_RSI;
  QDBusMenuItem *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  QDBusMenuItem copy;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar4;
  Inserter local_40;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusMenuItem::QDBusMenuItem
            ((QDBusMenuItem *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),in_RDI);
  uVar3 = *(long *)(in_RDI + 1) != 0 && in_RSI == (QArrayDataPointer<QDBusMenuItem> *)0x0;
  uVar4 = CONCAT13(uVar3,(int3)in_stack_ffffffffffffff9c);
  uVar1 = (uint)(*(long *)(in_RDI + 1) != 0 && in_RSI == (QArrayDataPointer<QDBusMenuItem> *)0x0);
  QArrayDataPointer<QDBusMenuItem>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QDBusMenuItem **)CONCAT44(uVar4,uVar1),
             (QArrayDataPointer<QDBusMenuItem> *)CONCAT17(uVar3,in_stack_ffffffffffffff90));
  if ((uVar4 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<QDBusMenuItem> *)CONCAT44(uVar4,uVar1),
                       CONCAT17(uVar3,in_stack_ffffffffffffff90),(qsizetype)in_RDI);
    Inserter::insertFill
              (in_RCX,(QDBusMenuItem *)CONCAT44(uVar4,uVar1),
               CONCAT17(uVar3,in_stack_ffffffffffffff90));
    Inserter::~Inserter(&local_40);
  }
  else {
    while (lVar2 = in_RDX + -1, in_RDX != 0) {
      QArrayDataPointer<QDBusMenuItem>::begin((QArrayDataPointer<QDBusMenuItem> *)0xafeeda);
      QDBusMenuItem::QDBusMenuItem
                ((QDBusMenuItem *)CONCAT17(uVar3,in_stack_ffffffffffffff90),in_RDI);
      (in_RDI->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)((long)&(in_RDI->m_properties).d.d.ptr[-1].m._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x18);
      *(long *)(in_RDI + 1) = *(long *)(in_RDI + 1) + 1;
      in_RDX = lVar2;
    }
  }
  QDBusMenuItem::~QDBusMenuItem((QDBusMenuItem *)0xafef4b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }